

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O1

void av1_convolve_y_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_y,int32_t subpel_y_qn)

{
  undefined4 uVar1;
  int16_t *piVar2;
  long lVar3;
  undefined1 (*pauVar4) [32];
  char cVar5;
  long lVar6;
  uint8_t *puVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [32];
  uint8_t *puVar10;
  long lVar11;
  uint uVar12;
  short *psVar13;
  uint *puVar14;
  ulong *puVar15;
  int32_t iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  undefined2 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  __m128i coeffs_1_2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar56 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m128i coeffs_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  __m128i coeffs_1_1;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar67 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar86 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  uint8_t *local_1f0;
  undefined1 local_1d8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_138 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 auVar83 [32];
  undefined1 auVar97 [32];
  
  piVar2 = filter_params_y->filter_ptr;
  uVar24 = (ulong)((subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
  if (filter_params_y->taps == 0xc) {
    if (0 < w) {
      local_138._4_4_ = *(undefined4 *)(piVar2 + uVar24);
      local_138._0_4_ = local_138._4_4_;
      local_138._8_4_ = local_138._4_4_;
      local_138._12_4_ = local_138._4_4_;
      local_138._16_4_ = local_138._4_4_;
      local_138._20_4_ = local_138._4_4_;
      local_138._24_4_ = local_138._4_4_;
      local_138._28_4_ = local_138._4_4_;
      local_78._4_4_ = *(undefined4 *)(piVar2 + uVar24 + 2);
      local_78._0_4_ = local_78._4_4_;
      local_78._8_4_ = local_78._4_4_;
      local_78._12_4_ = local_78._4_4_;
      local_78._16_4_ = local_78._4_4_;
      local_78._20_4_ = local_78._4_4_;
      local_78._24_4_ = local_78._4_4_;
      local_78._28_4_ = local_78._4_4_;
      uVar1 = *(undefined4 *)(piVar2 + uVar24 + 4);
      auVar104 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      local_98._4_4_ = *(undefined4 *)(piVar2 + uVar24 + 6);
      local_98._0_4_ = local_98._4_4_;
      local_98._8_4_ = local_98._4_4_;
      local_98._12_4_ = local_98._4_4_;
      local_98._16_4_ = local_98._4_4_;
      local_98._20_4_ = local_98._4_4_;
      local_98._24_4_ = local_98._4_4_;
      local_98._28_4_ = local_98._4_4_;
      local_b8._4_4_ = (undefined4)*(undefined8 *)(piVar2 + uVar24 + 8);
      local_b8._0_4_ = local_b8._4_4_;
      local_b8._8_4_ = local_b8._4_4_;
      local_b8._12_4_ = local_b8._4_4_;
      local_b8._16_4_ = local_b8._4_4_;
      local_b8._20_4_ = local_b8._4_4_;
      local_b8._24_4_ = local_b8._4_4_;
      local_b8._28_4_ = local_b8._4_4_;
      local_d8._4_4_ = (undefined4)((ulong)*(undefined8 *)(piVar2 + uVar24 + 8) >> 0x20);
      local_d8._0_4_ = local_d8._4_4_;
      local_d8._8_4_ = local_d8._4_4_;
      local_d8._12_4_ = local_d8._4_4_;
      local_d8._16_4_ = local_d8._4_4_;
      local_d8._20_4_ = local_d8._4_4_;
      local_d8._24_4_ = local_d8._4_4_;
      local_d8._28_4_ = local_d8._4_4_;
      lVar6 = (long)(src_stride * 5);
      lVar19 = (long)src_stride;
      lVar3 = (long)dst_stride;
      lVar22 = src_stride * 0xb - lVar6;
      lVar11 = src_stride * 0xc - lVar6;
      uVar24 = 0;
      do {
        if (0 < h) {
          lVar17 = uVar24 - lVar6;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(src + lVar19 * 9 + lVar17);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(src + lVar19 * 8 + lVar17);
          auVar49._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar67;
          auVar49._16_16_ = ZEXT116(1) * auVar27;
          auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar92 = vpunpcklbw_avx2(auVar49,auVar42);
          local_1d8._8_8_ = 0;
          local_1d8._0_8_ = *(ulong *)(src + lVar19 * 10 + lVar17);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(src + lVar19 * 10 + lVar17);
          auVar35._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar27;
          auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
          auVar150 = vpunpcklbw_avx2(auVar35,auVar42);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = *(ulong *)(src + lVar19 * 7 + lVar17);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(src + lVar19 * 6 + lVar17);
          auVar132._0_16_ = ZEXT116(0) * auVar121 + ZEXT116(1) * auVar28;
          auVar132._16_16_ = ZEXT116(1) * auVar121;
          auVar76._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar121;
          auVar76._16_16_ = ZEXT116(1) * auVar67;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)(src + lVar19 * 5 + lVar17);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(src + lVar19 * 4 + lVar17);
          auVar141._0_16_ = ZEXT116(0) * auVar122 + ZEXT116(1) * auVar134;
          auVar141._16_16_ = ZEXT116(1) * auVar122;
          auVar125._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar122;
          auVar125._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar28;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(src + lVar19 * 3 + lVar17);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(src + lVar19 * 2 + lVar17);
          auVar146._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar143;
          auVar146._16_16_ = ZEXT116(1) * auVar29;
          auVar136._0_16_ = ZEXT116(0) * auVar134 + ZEXT116(1) * auVar29;
          auVar136._16_16_ = ZEXT116(1) * auVar134;
          auVar149._8_8_ = 0;
          auVar149._0_8_ = *(ulong *)(src + lVar19 + lVar17);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(src + (uVar24 - lVar6));
          auVar151._0_16_ = ZEXT116(0) * auVar149 + ZEXT116(1) * auVar30;
          auVar151._16_16_ = ZEXT116(1) * auVar149;
          auVar144._0_16_ = ZEXT116(0) * auVar143 + ZEXT116(1) * auVar149;
          auVar144._16_16_ = ZEXT116(1) * auVar143;
          auVar142 = vpunpckhwd_avx2(auVar92,auVar150);
          auVar96 = vpunpcklbw_avx2(auVar132,auVar42);
          auVar78 = vpunpcklbw_avx2(auVar76,auVar42);
          auVar112 = vpunpcklwd_avx2(auVar92,auVar150);
          auVar92 = vpunpckhwd_avx2(auVar96,auVar78);
          auVar43 = vpunpcklbw_avx2(auVar141,auVar42);
          auVar101 = vpunpcklbw_avx2(auVar125,auVar42);
          auVar91 = vpunpcklwd_avx2(auVar96,auVar78);
          auVar150 = vpunpckhwd_avx2(auVar43,auVar101);
          auVar78 = vpunpcklbw_avx2(auVar146,auVar42);
          auVar129 = vpunpcklbw_avx2(auVar136,auVar42);
          auVar40 = vpunpcklwd_avx2(auVar43,auVar101);
          auVar96 = vpunpckhwd_avx2(auVar78,auVar129);
          auVar43 = vpunpcklbw_avx2(auVar151,auVar42);
          auVar101 = vpunpcklbw_avx2(auVar144,auVar42);
          auVar129 = vpunpcklwd_avx2(auVar78,auVar129);
          auVar78 = vpunpckhwd_avx2(auVar43,auVar101);
          auVar43 = vpunpcklwd_avx2(auVar43,auVar101);
          auVar45 = ZEXT116(0) * auVar112._0_16_ + ZEXT116(1) * local_1d8._0_16_;
          auVar56 = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * auVar112._0_16_;
          lVar17 = (uint)w - uVar24;
          lVar23 = 0;
          puVar7 = dst;
          puVar10 = src;
          do {
            auVar52 = auVar129;
            auVar129 = auVar40;
            auVar40 = auVar91;
            auVar39 = auVar92;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)(puVar10 + lVar22);
            auVar63._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar45;
            auVar63._16_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar31;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)(puVar10 + lVar11);
            auVar36._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar31;
            auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
            auVar92 = vpunpcklbw_avx2(auVar63,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar101 = vpunpcklbw_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar140 = vpunpcklwd_avx2(auVar92,auVar101);
            auVar42 = vpunpckhwd_avx2(auVar92,auVar101);
            auVar92 = vpmaddwd_avx2(auVar43,local_138);
            auVar43 = vpmaddwd_avx2(auVar52,local_78);
            auVar92 = vpaddd_avx2(auVar43,auVar92);
            auVar91 = auVar104._0_32_;
            auVar43 = vpmaddwd_avx2(auVar129,auVar91);
            auVar101 = vpmaddwd_avx2(auVar40,local_98);
            auVar43 = vpaddd_avx2(auVar43,auVar101);
            auVar92 = vpaddd_avx2(auVar92,auVar43);
            auVar43 = vpmaddwd_avx2(auVar112,local_b8);
            auVar92 = vpaddd_avx2(auVar92,auVar43);
            auVar43 = vpmaddwd_avx2(auVar140,local_d8);
            auVar77._8_4_ = 0x40;
            auVar77._0_8_ = 0x4000000040;
            auVar77._12_4_ = 0x40;
            auVar77._16_4_ = 0x40;
            auVar77._20_4_ = 0x40;
            auVar77._24_4_ = 0x40;
            auVar77._28_4_ = 0x40;
            auVar92 = vpaddd_avx2(auVar92,auVar77);
            auVar92 = vpaddd_avx2(auVar43,auVar92);
            auVar92 = vpsrad_avx2(auVar92,7);
            auVar92 = vpackssdw_avx2(auVar92,auVar92);
            auVar92 = vpackuswb_avx2(auVar92,auVar92);
            if (lVar17 < 5) {
              if (lVar17 < 3) {
                vpextrw_avx(auVar92._0_16_,0);
                vpextrw_avx(auVar92._16_16_,0);
              }
              else {
                *(int *)puVar7 = auVar92._0_4_;
                *(int *)(puVar7 + lVar3) = auVar92._16_4_;
              }
            }
            else {
              auVar78 = vpmaddwd_avx2(auVar78,local_138);
              auVar43 = vpmaddwd_avx2(auVar96,local_78);
              auVar78 = vpaddd_avx2(auVar43,auVar78);
              auVar43 = vpmaddwd_avx2(auVar150,auVar91);
              auVar101 = vpmaddwd_avx2(auVar39,local_98);
              auVar43 = vpaddd_avx2(auVar43,auVar101);
              auVar78 = vpaddd_avx2(auVar78,auVar43);
              auVar43 = vpmaddwd_avx2(auVar142,local_b8);
              auVar78 = vpaddd_avx2(auVar78,auVar43);
              auVar43 = vpmaddwd_avx2(auVar42,local_d8);
              auVar78 = vpaddd_avx2(auVar78,auVar77);
              auVar78 = vpaddd_avx2(auVar78,auVar43);
              auVar78 = vpsrad_avx2(auVar78,7);
              auVar78 = vpackssdw_avx2(auVar78,local_78);
              auVar78 = vpackuswb_avx2(auVar78,local_78);
              auVar92 = vpunpckldq_avx2(auVar92,auVar78);
              *(long *)puVar7 = auVar92._0_8_;
              *(long *)(puVar7 + lVar3) = auVar92._16_8_;
            }
            auVar104 = ZEXT3264(auVar91);
            auVar45 = ZEXT116(0) * auVar140._0_16_ + ZEXT116(1) * auVar46;
            auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar140._0_16_;
            lVar23 = lVar23 + 2;
            puVar7 = puVar7 + lVar3 * 2;
            puVar10 = puVar10 + lVar19 * 2;
            auVar92 = auVar142;
            auVar91 = auVar112;
            auVar78 = auVar96;
            auVar96 = auVar150;
            auVar142 = auVar42;
            auVar150 = auVar39;
            auVar112 = auVar140;
            auVar43 = auVar52;
          } while (lVar23 < h);
        }
        uVar24 = uVar24 + 8;
        dst = dst + 8;
        lVar22 = lVar22 + 8;
        lVar11 = lVar11 + 8;
      } while (uVar24 < (uint)w);
    }
  }
  else {
    cVar5 = '\b';
    if ((piVar2[uVar24 + 7] == 0 && piVar2[uVar24] == 0) &&
       (cVar5 = '\x06', piVar2[uVar24 + 6] == 0 && piVar2[uVar24 + 1] == 0)) {
      cVar5 = (piVar2[uVar24 + 5] != 0 || piVar2[uVar24 + 2] != 0) * '\x02' + '\x02';
    }
    local_1f0 = src;
    switch(cVar5) {
    case '\x02':
      if (subpel_y_qn == 8) {
        if (w < 9) {
          if (w == 4) {
            uVar12 = *(uint *)src;
            do {
              uVar21 = *(uint *)(local_1f0 + src_stride);
              auVar45 = vpavgb_avx(ZEXT416(uVar12),ZEXT416(uVar21));
              *(int *)dst = auVar45._0_4_;
              uVar12 = *(uint *)(local_1f0 + src_stride * 2);
              local_1f0 = local_1f0 + src_stride * 2;
              auVar45 = vpavgb_avx(ZEXT416(uVar21),ZEXT416(uVar12));
              *(int *)(dst + dst_stride) = auVar45._0_4_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 2) {
            uVar12 = (uint)*(short *)src;
            do {
              auVar45 = vpavgb_avx(ZEXT416(uVar12),
                                   ZEXT416((uint)(int)*(short *)(local_1f0 + src_stride)));
              vpextrw_avx(auVar45,0);
              uVar12 = (uint)*(short *)(local_1f0 + src_stride * 2);
              auVar45 = vpavgb_avx(ZEXT416((uint)(int)*(short *)(local_1f0 + src_stride)),
                                   ZEXT416(uVar12));
              vpextrw_avx(auVar45,0);
              local_1f0 = local_1f0 + src_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            uVar24 = *(ulong *)src;
            do {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar24;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = *(ulong *)(local_1f0 + src_stride);
              auVar45 = vpavgb_avx(auVar33,auVar47);
              *(long *)dst = auVar45._0_8_;
              uVar24 = *(ulong *)(local_1f0 + src_stride * 2);
              local_1f0 = local_1f0 + src_stride * 2;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar24;
              auVar45 = vpavgb_avx(auVar47,auVar34);
              *(long *)(dst + dst_stride) = auVar45._0_8_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
        }
        else if (w == 0x40) {
          auVar92 = *(undefined1 (*) [32])src;
          auVar142 = *(undefined1 (*) [32])(src + 0x20);
          puVar7 = src + 0x20;
          lVar6 = (long)src_stride;
          lVar3 = lVar6 * 2;
          pauVar4 = (undefined1 (*) [32])(dst + 0x20);
          do {
            auVar150 = *(undefined1 (*) [32])(puVar7 + lVar6 + -0x20);
            auVar92 = vpavgb_avx2(auVar92,auVar150);
            pauVar4[-1] = auVar92;
            auVar96 = *(undefined1 (*) [32])(puVar7 + lVar6);
            auVar142 = vpavgb_avx2(auVar142,auVar96);
            *pauVar4 = auVar142;
            auVar92 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x20);
            auVar142 = vpavgb_avx2(auVar150,auVar92);
            *(undefined1 (*) [32])(pauVar4[-1] + dst_stride) = auVar142;
            auVar142 = *(undefined1 (*) [32])(puVar7 + lVar3);
            puVar7 = puVar7 + lVar3;
            auVar150 = vpavgb_avx2(auVar96,auVar142);
            *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar150;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x20) {
          auVar142 = *(undefined1 (*) [32])src;
          do {
            auVar92 = *(undefined1 (*) [32])(local_1f0 + src_stride);
            auVar142 = vpavgb_avx2(auVar142,auVar92);
            *(undefined1 (*) [32])dst = auVar142;
            auVar142 = *(undefined1 (*) [32])(local_1f0 + src_stride * 2);
            local_1f0 = local_1f0 + src_stride * 2;
            auVar92 = vpavgb_avx2(auVar92,auVar142);
            *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar92;
            dst = *(undefined1 (*) [32])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar45 = *(undefined1 (*) [16])src;
          do {
            auVar56 = *(undefined1 (*) [16])(local_1f0 + src_stride);
            auVar45 = vpavgb_avx(auVar45,auVar56);
            *(undefined1 (*) [16])dst = auVar45;
            auVar45 = *(undefined1 (*) [16])(local_1f0 + src_stride * 2);
            local_1f0 = local_1f0 + src_stride * 2;
            auVar56 = vpavgb_avx(auVar56,auVar45);
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar56;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar142 = *(undefined1 (*) [32])src;
          auVar150 = *(undefined1 (*) [32])(src + 0x20);
          auVar96 = *(undefined1 (*) [32])(src + 0x40);
          auVar92 = *(undefined1 (*) [32])(src + 0x60);
          puVar7 = src + 0x60;
          lVar6 = (long)src_stride;
          lVar3 = lVar6 * 2;
          pauVar4 = (undefined1 (*) [32])(dst + 0x60);
          do {
            auVar78 = *(undefined1 (*) [32])(puVar7 + lVar6 + -0x60);
            auVar142 = vpavgb_avx2(auVar142,auVar78);
            pauVar4[-3] = auVar142;
            auVar43 = *(undefined1 (*) [32])(puVar7 + lVar6 + -0x40);
            auVar142 = vpavgb_avx2(auVar150,auVar43);
            pauVar4[-2] = auVar142;
            auVar101 = *(undefined1 (*) [32])(puVar7 + lVar6 + -0x20);
            auVar142 = vpavgb_avx2(auVar96,auVar101);
            pauVar4[-1] = auVar142;
            auVar129 = *(undefined1 (*) [32])(puVar7 + lVar6);
            auVar142 = vpavgb_avx2(auVar92,auVar129);
            *pauVar4 = auVar142;
            auVar142 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x60);
            auVar92 = vpavgb_avx2(auVar78,auVar142);
            *(undefined1 (*) [32])(pauVar4[-3] + dst_stride) = auVar92;
            auVar150 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x40);
            auVar92 = vpavgb_avx2(auVar43,auVar150);
            *(undefined1 (*) [32])(pauVar4[-2] + dst_stride) = auVar92;
            auVar96 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x20);
            auVar92 = vpavgb_avx2(auVar101,auVar96);
            *(undefined1 (*) [32])(pauVar4[-1] + dst_stride) = auVar92;
            auVar92 = *(undefined1 (*) [32])(puVar7 + lVar3);
            puVar7 = puVar7 + lVar3;
            auVar78 = vpavgb_avx2(auVar129,auVar92);
            *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar78;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
      }
      else if (w < 9) {
        auVar45 = vpsrlw_avx(ZEXT416(*(uint *)(piVar2 + uVar24 + 3)),1);
        auVar45 = vpshufb_avx(auVar45,_DAT_005156d0);
        if (w == 4) {
          uVar12 = *(uint *)src;
          lVar3 = (long)src_stride;
          auVar61._8_2_ = 0x20;
          auVar61._0_8_ = 0x20002000200020;
          auVar61._10_2_ = 0x20;
          auVar61._12_2_ = 0x20;
          auVar61._14_2_ = 0x20;
          do {
            auVar56 = vpinsrd_avx(ZEXT416(uVar12),*(uint *)(local_1f0 + lVar3),1);
            uVar12 = *(uint *)(local_1f0 + lVar3 * 2);
            auVar75 = vpinsrd_avx(ZEXT416(*(uint *)(local_1f0 + lVar3)),
                                  *(undefined4 *)(local_1f0 + lVar3 * 2),1);
            auVar56 = vpunpcklbw_avx(auVar56,auVar75);
            auVar56 = vpmaddubsw_avx(auVar56,auVar45);
            auVar56 = vpaddw_avx(auVar56,auVar61);
            auVar56 = vpsraw_avx(auVar56,6);
            auVar56 = vpackuswb_avx(auVar56,auVar56);
            *(int *)dst = auVar56._0_4_;
            iVar18 = vpextrw_avx(auVar56,3);
            uVar21 = vpextrw_avx(auVar56,2);
            *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
            local_1f0 = local_1f0 + src_stride * 2;
            dst = dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 2) {
          uVar12 = (uint)*(short *)src;
          auVar57._8_2_ = 0x20;
          auVar57._0_8_ = 0x20002000200020;
          auVar57._10_2_ = 0x20;
          auVar57._12_2_ = 0x20;
          auVar57._14_2_ = 0x20;
          do {
            auVar56 = vpunpcklwd_avx(ZEXT416(uVar12),
                                     ZEXT416((uint)(int)*(short *)(local_1f0 + src_stride)));
            uVar12 = (uint)*(short *)(local_1f0 + (long)src_stride * 2);
            auVar75 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(local_1f0 + src_stride)),
                                     ZEXT416(uVar12));
            auVar56 = vpunpcklbw_avx(auVar56,auVar75);
            auVar56 = vpmaddubsw_avx(auVar56,auVar45);
            auVar56 = vpaddw_avx(auVar56,auVar57);
            auVar56 = vpsraw_avx(auVar56,6);
            auVar56 = vpackuswb_avx(auVar56,auVar56);
            vpextrw_avx(auVar56,0);
            vpextrw_avx(auVar56,1);
            local_1f0 = local_1f0 + src_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else {
          uVar24 = *(ulong *)src;
          iVar18 = src_stride * 2;
          auVar48._8_2_ = 0x20;
          auVar48._0_8_ = 0x20002000200020;
          auVar48._10_2_ = 0x20;
          auVar48._12_2_ = 0x20;
          auVar48._14_2_ = 0x20;
          do {
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar24;
            auVar56 = vpinsrq_avx(auVar62,*(ulong *)(local_1f0 + src_stride),1);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)(local_1f0 + src_stride);
            auVar114 = vpunpcklbw_avx(auVar62,auVar90);
            uVar24 = *(ulong *)(local_1f0 + iVar18);
            auVar109._8_8_ = *(undefined8 *)(local_1f0 + iVar18);
            auVar109._0_8_ = *(undefined8 *)(local_1f0 + iVar18);
            local_1f0 = local_1f0 + iVar18;
            auVar75 = vpunpckhbw_avx(auVar56,auVar109);
            auVar56 = vpmaddubsw_avx(auVar114,auVar45);
            auVar75 = vpmaddubsw_avx(auVar75,auVar45);
            auVar56 = vpaddw_avx(auVar56,auVar48);
            auVar56 = vpsraw_avx(auVar56,6);
            auVar56 = vpackuswb_avx(auVar56,auVar56);
            auVar75 = vpaddw_avx(auVar75,auVar48);
            auVar75 = vpsraw_avx(auVar75,6);
            auVar75 = vpackuswb_avx(auVar75,auVar75);
            *(long *)dst = auVar56._0_8_;
            *(long *)(dst + dst_stride) = auVar75._0_8_;
            dst = dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
      }
      else {
        auVar45 = ZEXT416(*(uint *)(piVar2 + uVar24 + 3));
        auVar41._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar45;
        auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
        auVar142 = vpsrlw_avx2(auVar41,1);
        auVar142 = vpshufb_avx2(auVar142,_DAT_00569e20);
        if (w == 0x40) {
          auVar92 = *(undefined1 (*) [32])src;
          auVar150 = *(undefined1 (*) [32])(src + 0x20);
          puVar7 = src + 0x20;
          lVar3 = (long)(src_stride * 2);
          pauVar4 = (undefined1 (*) [32])(dst + 0x20);
          auVar54._8_2_ = 0x20;
          auVar54._0_8_ = 0x20002000200020;
          auVar54._10_2_ = 0x20;
          auVar54._12_2_ = 0x20;
          auVar54._14_2_ = 0x20;
          auVar54._16_2_ = 0x20;
          auVar54._18_2_ = 0x20;
          auVar54._20_2_ = 0x20;
          auVar54._22_2_ = 0x20;
          auVar54._24_2_ = 0x20;
          auVar54._26_2_ = 0x20;
          auVar54._28_2_ = 0x20;
          auVar54._30_2_ = 0x20;
          do {
            auVar96 = *(undefined1 (*) [32])(puVar7 + (long)src_stride + -0x20);
            auVar43 = vpunpcklbw_avx2(auVar92,auVar96);
            auVar78 = vpunpckhbw_avx2(auVar92,auVar96);
            auVar92 = vpmaddubsw_avx2(auVar43,auVar142);
            auVar78 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar54);
            auVar43 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar78,auVar54);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar43,auVar92);
            pauVar4[-1] = auVar92;
            auVar78 = *(undefined1 (*) [32])(puVar7 + src_stride);
            auVar92 = vpunpcklbw_avx2(auVar150,auVar78);
            auVar150 = vpunpckhbw_avx2(auVar150,auVar78);
            auVar92 = vpmaddubsw_avx2(auVar92,auVar142);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar54);
            auVar43 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar150,auVar54);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar43,auVar92);
            *pauVar4 = auVar92;
            auVar92 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x20);
            auVar150 = vpunpcklbw_avx2(auVar96,auVar92);
            auVar96 = vpunpckhbw_avx2(auVar96,auVar92);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar150 = vpaddw_avx2(auVar150,auVar54);
            auVar43 = vpsraw_avx2(auVar150,6);
            auVar150 = vpaddw_avx2(auVar96,auVar54);
            auVar150 = vpsraw_avx2(auVar150,6);
            auVar150 = vpackuswb_avx2(auVar43,auVar150);
            *(undefined1 (*) [32])(pauVar4[-1] + dst_stride) = auVar150;
            auVar150 = *(undefined1 (*) [32])(puVar7 + lVar3);
            puVar7 = puVar7 + lVar3;
            auVar96 = vpunpcklbw_avx2(auVar78,auVar150);
            auVar78 = vpunpckhbw_avx2(auVar78,auVar150);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar78 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar96 = vpaddw_avx2(auVar96,auVar54);
            auVar43 = vpsraw_avx2(auVar96,6);
            auVar96 = vpaddw_avx2(auVar78,auVar54);
            auVar96 = vpsraw_avx2(auVar96,6);
            auVar96 = vpackuswb_avx2(auVar43,auVar96);
            *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar96;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x20) {
          auVar92 = *(undefined1 (*) [32])src;
          auVar53._8_2_ = 0x20;
          auVar53._0_8_ = 0x20002000200020;
          auVar53._10_2_ = 0x20;
          auVar53._12_2_ = 0x20;
          auVar53._14_2_ = 0x20;
          auVar53._16_2_ = 0x20;
          auVar53._18_2_ = 0x20;
          auVar53._20_2_ = 0x20;
          auVar53._22_2_ = 0x20;
          auVar53._24_2_ = 0x20;
          auVar53._26_2_ = 0x20;
          auVar53._28_2_ = 0x20;
          auVar53._30_2_ = 0x20;
          do {
            auVar150 = *(undefined1 (*) [32])(local_1f0 + src_stride);
            auVar78 = vpunpcklbw_avx2(auVar92,auVar150);
            auVar96 = vpunpckhbw_avx2(auVar92,auVar150);
            auVar92 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar53);
            auVar78 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar96,auVar53);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar78,auVar92);
            *(undefined1 (*) [32])dst = auVar92;
            auVar92 = *(undefined1 (*) [32])(local_1f0 + src_stride * 2);
            local_1f0 = local_1f0 + src_stride * 2;
            auVar78 = vpunpcklbw_avx2(auVar150,auVar92);
            auVar96 = vpunpckhbw_avx2(auVar150,auVar92);
            auVar150 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar150 = vpaddw_avx2(auVar150,auVar53);
            auVar78 = vpsraw_avx2(auVar150,6);
            auVar150 = vpaddw_avx2(auVar96,auVar53);
            auVar150 = vpsraw_avx2(auVar150,6);
            auVar150 = vpackuswb_avx2(auVar78,auVar150);
            *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar150;
            dst = *(undefined1 (*) [32])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar45 = *(undefined1 (*) [16])src;
          auVar65._8_2_ = 0x20;
          auVar65._0_8_ = 0x20002000200020;
          auVar65._10_2_ = 0x20;
          auVar65._12_2_ = 0x20;
          auVar65._14_2_ = 0x20;
          auVar65._16_2_ = 0x20;
          auVar65._18_2_ = 0x20;
          auVar65._20_2_ = 0x20;
          auVar65._22_2_ = 0x20;
          auVar65._24_2_ = 0x20;
          auVar65._26_2_ = 0x20;
          auVar65._28_2_ = 0x20;
          auVar65._30_2_ = 0x20;
          do {
            auVar56 = *(undefined1 (*) [16])(local_1f0 + src_stride);
            auVar95._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
            auVar95._16_16_ = ZEXT116(1) * auVar56;
            auVar45 = *(undefined1 (*) [16])(local_1f0 + (long)src_stride * 2);
            auVar80._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar56;
            auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            auVar92 = vpunpcklbw_avx2(auVar95,auVar80);
            auVar150 = vpunpckhbw_avx2(auVar95,auVar80);
            auVar92 = vpmaddubsw_avx2(auVar92,auVar142);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar65);
            auVar96 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar150,auVar65);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar96,auVar92);
            *(undefined1 (*) [16])dst = auVar92._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar92._16_16_;
            local_1f0 = local_1f0 + src_stride * 2;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar96 = *(undefined1 (*) [32])src;
          auVar78 = *(undefined1 (*) [32])(src + 0x20);
          auVar92 = *(undefined1 (*) [32])(src + 0x40);
          auVar150 = *(undefined1 (*) [32])(src + 0x60);
          puVar7 = src + 0x60;
          lVar3 = (long)(src_stride * 2);
          pauVar4 = (undefined1 (*) [32])(dst + 0x60);
          auVar55._8_2_ = 0x20;
          auVar55._0_8_ = 0x20002000200020;
          auVar55._10_2_ = 0x20;
          auVar55._12_2_ = 0x20;
          auVar55._14_2_ = 0x20;
          auVar55._16_2_ = 0x20;
          auVar55._18_2_ = 0x20;
          auVar55._20_2_ = 0x20;
          auVar55._22_2_ = 0x20;
          auVar55._24_2_ = 0x20;
          auVar55._26_2_ = 0x20;
          auVar55._28_2_ = 0x20;
          auVar55._30_2_ = 0x20;
          do {
            auVar43 = *(undefined1 (*) [32])(puVar7 + (long)src_stride + -0x60);
            auVar129 = vpunpcklbw_avx2(auVar96,auVar43);
            auVar101 = vpunpckhbw_avx2(auVar96,auVar43);
            auVar96 = vpmaddubsw_avx2(auVar129,auVar142);
            auVar101 = vpmaddubsw_avx2(auVar101,auVar142);
            auVar96 = vpaddw_avx2(auVar96,auVar55);
            auVar129 = vpsraw_avx2(auVar96,6);
            auVar96 = vpaddw_avx2(auVar101,auVar55);
            auVar96 = vpsraw_avx2(auVar96,6);
            auVar96 = vpackuswb_avx2(auVar129,auVar96);
            pauVar4[-3] = auVar96;
            auVar101 = *(undefined1 (*) [32])(puVar7 + (long)src_stride + -0x40);
            auVar96 = vpunpcklbw_avx2(auVar78,auVar101);
            auVar78 = vpunpckhbw_avx2(auVar78,auVar101);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar78 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar96 = vpaddw_avx2(auVar96,auVar55);
            auVar129 = vpsraw_avx2(auVar96,6);
            auVar96 = vpaddw_avx2(auVar78,auVar55);
            auVar96 = vpsraw_avx2(auVar96,6);
            auVar96 = vpackuswb_avx2(auVar129,auVar96);
            pauVar4[-2] = auVar96;
            auVar129 = *(undefined1 (*) [32])(puVar7 + (long)src_stride + -0x20);
            auVar78 = vpunpcklbw_avx2(auVar92,auVar129);
            auVar96 = vpunpckhbw_avx2(auVar92,auVar129);
            auVar92 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar96 = vpmaddubsw_avx2(auVar96,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar55);
            auVar78 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar96,auVar55);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar78,auVar92);
            pauVar4[-1] = auVar92;
            auVar112 = *(undefined1 (*) [32])(puVar7 + src_stride);
            auVar92 = vpunpcklbw_avx2(auVar150,auVar112);
            auVar150 = vpunpckhbw_avx2(auVar150,auVar112);
            auVar92 = vpmaddubsw_avx2(auVar92,auVar142);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar55);
            auVar96 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar150,auVar55);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar96,auVar92);
            *pauVar4 = auVar92;
            auVar96 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x60);
            auVar92 = vpunpcklbw_avx2(auVar43,auVar96);
            auVar150 = vpunpckhbw_avx2(auVar43,auVar96);
            auVar92 = vpmaddubsw_avx2(auVar92,auVar142);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar55);
            auVar78 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar150,auVar55);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar78,auVar92);
            *(undefined1 (*) [32])(pauVar4[-3] + dst_stride) = auVar92;
            auVar78 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x40);
            auVar92 = vpunpcklbw_avx2(auVar101,auVar78);
            auVar150 = vpunpckhbw_avx2(auVar101,auVar78);
            auVar92 = vpmaddubsw_avx2(auVar92,auVar142);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar92 = vpaddw_avx2(auVar92,auVar55);
            auVar43 = vpsraw_avx2(auVar92,6);
            auVar92 = vpaddw_avx2(auVar150,auVar55);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar43,auVar92);
            *(undefined1 (*) [32])(pauVar4[-2] + dst_stride) = auVar92;
            auVar92 = *(undefined1 (*) [32])(puVar7 + lVar3 + -0x20);
            auVar150 = vpunpcklbw_avx2(auVar129,auVar92);
            auVar43 = vpunpckhbw_avx2(auVar129,auVar92);
            auVar150 = vpmaddubsw_avx2(auVar150,auVar142);
            auVar43 = vpmaddubsw_avx2(auVar43,auVar142);
            auVar150 = vpaddw_avx2(auVar150,auVar55);
            auVar101 = vpsraw_avx2(auVar150,6);
            auVar150 = vpaddw_avx2(auVar43,auVar55);
            auVar150 = vpsraw_avx2(auVar150,6);
            auVar150 = vpackuswb_avx2(auVar101,auVar150);
            *(undefined1 (*) [32])(pauVar4[-1] + dst_stride) = auVar150;
            auVar150 = *(undefined1 (*) [32])(puVar7 + lVar3);
            puVar7 = puVar7 + lVar3;
            auVar43 = vpunpcklbw_avx2(auVar112,auVar150);
            auVar101 = vpunpckhbw_avx2(auVar112,auVar150);
            auVar43 = vpmaddubsw_avx2(auVar43,auVar142);
            auVar101 = vpmaddubsw_avx2(auVar101,auVar142);
            auVar43 = vpaddw_avx2(auVar43,auVar55);
            auVar129 = vpsraw_avx2(auVar43,6);
            auVar43 = vpaddw_avx2(auVar101,auVar55);
            auVar43 = vpsraw_avx2(auVar43,6);
            auVar43 = vpackuswb_avx2(auVar129,auVar43);
            *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar43;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
      }
      break;
    case '\x04':
      lVar3 = (long)src_stride;
      pauVar4 = (undefined1 (*) [32])(src + -lVar3);
      auVar45 = vpsraw_avx(*(undefined1 (*) [16])(piVar2 + uVar24),1);
      if (w < 5) {
        auVar56 = vpshufb_avx(auVar45,_DAT_00515720);
        auVar45 = vpshufb_avx(auVar45,_DAT_005156f0);
        if (w == 2) {
          uVar12 = (uint)*(short *)(*pauVar4 + lVar3 * 2);
          auVar75 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar4),
                                   ZEXT416((uint)(int)*(short *)src));
          auVar114 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),ZEXT416(uVar12));
          auVar75 = vpunpcklbw_avx(auVar75,auVar114);
          psVar13 = (short *)(src + lVar3 * 2);
          auVar68._8_2_ = 0x20;
          auVar68._0_8_ = 0x20002000200020;
          auVar68._10_2_ = 0x20;
          auVar68._12_2_ = 0x20;
          auVar68._14_2_ = 0x20;
          do {
            auVar131 = vpunpcklwd_avx(ZEXT416(uVar12),ZEXT416((uint)(int)*psVar13));
            uVar12 = (uint)*(short *)((long)psVar13 + lVar3);
            auVar135 = vpunpcklwd_avx(ZEXT416((uint)(int)*psVar13),ZEXT416(uVar12));
            auVar114 = vpmaddubsw_avx(auVar75,auVar56);
            auVar75 = vpunpcklbw_avx(auVar131,auVar135);
            auVar114 = vpaddw_avx(auVar114,auVar68);
            auVar131 = vpmaddubsw_avx(auVar75,auVar45);
            auVar114 = vpaddw_avx(auVar114,auVar131);
            auVar114 = vpsraw_avx(auVar114,6);
            auVar114 = vpackuswb_avx(auVar114,auVar114);
            vpextrw_avx(auVar114,0);
            vpextrw_avx(auVar114,1);
            psVar13 = psVar13 + lVar3;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar75 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar4),*(uint *)src,1);
          auVar114 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)(*pauVar4 + lVar3 * 2),1);
          uVar12 = *(uint *)(*pauVar4 + lVar3 * 2);
          auVar75 = vpunpcklbw_avx(auVar75,auVar114);
          puVar14 = (uint *)(src + lVar3 * 2);
          auVar70._8_2_ = 0x20;
          auVar70._0_8_ = 0x20002000200020;
          auVar70._10_2_ = 0x20;
          auVar70._12_2_ = 0x20;
          auVar70._14_2_ = 0x20;
          do {
            auVar114 = vpinsrd_avx(ZEXT416(uVar12),*puVar14,1);
            auVar131 = vpinsrd_avx(ZEXT416(*puVar14),*(undefined4 *)((long)puVar14 + lVar3),1);
            uVar12 = *(uint *)((long)puVar14 + lVar3);
            auVar135 = vpmaddubsw_avx(auVar75,auVar56);
            auVar75 = vpunpcklbw_avx(auVar114,auVar131);
            auVar114 = vpaddw_avx(auVar135,auVar70);
            auVar131 = vpmaddubsw_avx(auVar75,auVar45);
            auVar114 = vpaddw_avx(auVar114,auVar131);
            auVar114 = vpsraw_avx(auVar114,6);
            auVar114 = vpackuswb_avx(auVar114,auVar114);
            *(int *)dst = auVar114._0_4_;
            iVar18 = vpextrw_avx(auVar114,3);
            uVar21 = vpextrw_avx(auVar114,2);
            *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
            dst = dst + dst_stride * 2;
            puVar14 = (uint *)((long)puVar14 + lVar3 * 2);
            h = h + -2;
          } while (h != 0);
        }
      }
      else {
        auVar56 = vpshufb_avx(auVar45,_DAT_00569f00);
        auVar38._0_2_ = auVar56._0_2_;
        auVar38._2_2_ = auVar38._0_2_;
        auVar38._4_2_ = auVar38._0_2_;
        auVar38._6_2_ = auVar38._0_2_;
        auVar38._8_2_ = auVar38._0_2_;
        auVar38._10_2_ = auVar38._0_2_;
        auVar38._12_2_ = auVar38._0_2_;
        auVar38._14_2_ = auVar38._0_2_;
        auVar38._16_2_ = auVar38._0_2_;
        auVar38._18_2_ = auVar38._0_2_;
        auVar38._20_2_ = auVar38._0_2_;
        auVar38._22_2_ = auVar38._0_2_;
        auVar38._24_2_ = auVar38._0_2_;
        auVar38._26_2_ = auVar38._0_2_;
        auVar38._28_2_ = auVar38._0_2_;
        auVar38._30_2_ = auVar38._0_2_;
        auVar45 = vpshufb_avx(auVar45,_DAT_00569f10);
        auVar51._0_2_ = auVar45._0_2_;
        auVar51._2_2_ = auVar51._0_2_;
        auVar51._4_2_ = auVar51._0_2_;
        auVar51._6_2_ = auVar51._0_2_;
        auVar51._8_2_ = auVar51._0_2_;
        auVar51._10_2_ = auVar51._0_2_;
        auVar51._12_2_ = auVar51._0_2_;
        auVar51._14_2_ = auVar51._0_2_;
        auVar51._16_2_ = auVar51._0_2_;
        auVar51._18_2_ = auVar51._0_2_;
        auVar51._20_2_ = auVar51._0_2_;
        auVar51._22_2_ = auVar51._0_2_;
        auVar51._24_2_ = auVar51._0_2_;
        auVar51._26_2_ = auVar51._0_2_;
        auVar51._28_2_ = auVar51._0_2_;
        auVar51._30_2_ = auVar51._0_2_;
        if (w == 8) {
          uVar24 = *(ulong *)(*pauVar4 + lVar3 * 2);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)src;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)*pauVar4;
          auVar83._0_16_ = ZEXT116(0) * auVar89 + ZEXT116(1) * auVar74;
          auVar83._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar24;
          auVar103._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar89;
          auVar103._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
          auVar142 = vpunpcklbw_avx2(auVar83,auVar103);
          puVar15 = (ulong *)(src + lVar3 * 2);
          auVar84._8_2_ = 0x20;
          auVar84._0_8_ = 0x20002000200020;
          auVar84._10_2_ = 0x20;
          auVar84._12_2_ = 0x20;
          auVar84._14_2_ = 0x20;
          auVar84._16_2_ = 0x20;
          auVar84._18_2_ = 0x20;
          auVar84._20_2_ = 0x20;
          auVar84._22_2_ = 0x20;
          auVar84._24_2_ = 0x20;
          auVar84._26_2_ = 0x20;
          auVar84._28_2_ = 0x20;
          auVar84._30_2_ = 0x20;
          do {
            auVar108._8_8_ = 0;
            auVar108._0_8_ = *puVar15;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar24;
            auVar120._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar59;
            auVar120._16_16_ = ZEXT116(1) * auVar108;
            uVar24 = *(ulong *)((long)puVar15 + lVar3);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar24;
            auVar113._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar108;
            auVar113._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
            auVar92 = vpmaddubsw_avx2(auVar142,auVar38);
            auVar142 = vpunpcklbw_avx2(auVar120,auVar113);
            auVar92 = vpaddw_avx2(auVar92,auVar84);
            auVar150 = vpmaddubsw_avx2(auVar142,auVar51);
            auVar92 = vpaddw_avx2(auVar92,auVar150);
            auVar92 = vpsraw_avx2(auVar92,6);
            auVar92 = vpackuswb_avx2(auVar92,auVar38);
            *(long *)dst = auVar92._0_8_;
            *(long *)(dst + dst_stride) = auVar92._16_8_;
            dst = dst + dst_stride * 2;
            puVar15 = (ulong *)((long)puVar15 + lVar3 * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar45 = *(undefined1 (*) [16])src;
          auVar56 = *(undefined1 (*) [16])(*pauVar4 + lVar3 * 2);
          auVar81._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *(undefined1 (*) [16])*pauVar4;
          auVar81._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar102._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
          auVar102._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
          auVar92 = vpunpcklbw_avx2(auVar81,auVar102);
          auVar142 = vpunpckhbw_avx2(auVar81,auVar102);
          pauVar8 = (undefined1 (*) [16])(src + lVar3 * 2);
          auVar82._8_2_ = 0x20;
          auVar82._0_8_ = 0x20002000200020;
          auVar82._10_2_ = 0x20;
          auVar82._12_2_ = 0x20;
          auVar82._14_2_ = 0x20;
          auVar82._16_2_ = 0x20;
          auVar82._18_2_ = 0x20;
          auVar82._20_2_ = 0x20;
          auVar82._22_2_ = 0x20;
          auVar82._24_2_ = 0x20;
          auVar82._26_2_ = 0x20;
          auVar82._28_2_ = 0x20;
          auVar82._30_2_ = 0x20;
          do {
            auVar45 = *pauVar8;
            auVar130._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar56;
            auVar130._16_16_ = ZEXT116(1) * auVar45;
            auVar56 = *(undefined1 (*) [16])(*pauVar8 + lVar3);
            auVar119._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
            auVar119._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
            auVar150 = vpmaddubsw_avx2(auVar92,auVar38);
            auVar92 = vpunpcklbw_avx2(auVar130,auVar119);
            auVar96 = vpmaddubsw_avx2(auVar142,auVar38);
            auVar142 = vpunpckhbw_avx2(auVar130,auVar119);
            auVar78 = vpmaddubsw_avx2(auVar92,auVar51);
            auVar43 = vpmaddubsw_avx2(auVar142,auVar51);
            auVar150 = vpaddw_avx2(auVar150,auVar82);
            auVar150 = vpaddw_avx2(auVar150,auVar78);
            auVar78 = vpsraw_avx2(auVar150,6);
            auVar150 = vpaddw_avx2(auVar96,auVar82);
            auVar150 = vpaddw_avx2(auVar43,auVar150);
            auVar150 = vpsraw_avx2(auVar150,6);
            auVar150 = vpackuswb_avx2(auVar78,auVar150);
            *(undefined1 (*) [16])dst = auVar150._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar150._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x20) {
          auVar142 = *(undefined1 (*) [32])src;
          auVar92 = *(undefined1 (*) [32])(*pauVar4 + lVar3 * 2);
          auVar78 = vpunpcklbw_avx2(*pauVar4,auVar142);
          auVar150 = vpunpckhbw_avx2(*pauVar4,auVar142);
          auVar96 = vpunpcklbw_avx2(auVar142,auVar92);
          auVar142 = vpunpckhbw_avx2(auVar142,auVar92);
          pauVar4 = (undefined1 (*) [32])(src + lVar3 * 2);
          auVar79._8_2_ = 0x20;
          auVar79._0_8_ = 0x20002000200020;
          auVar79._10_2_ = 0x20;
          auVar79._12_2_ = 0x20;
          auVar79._14_2_ = 0x20;
          auVar79._16_2_ = 0x20;
          auVar79._18_2_ = 0x20;
          auVar79._20_2_ = 0x20;
          auVar79._22_2_ = 0x20;
          auVar79._24_2_ = 0x20;
          auVar79._26_2_ = 0x20;
          auVar79._28_2_ = 0x20;
          auVar79._30_2_ = 0x20;
          do {
            auVar43 = *pauVar4;
            auVar101 = vpmaddubsw_avx2(auVar78,auVar38);
            auVar78 = vpunpcklbw_avx2(auVar92,auVar43);
            auVar129 = vpmaddubsw_avx2(auVar150,auVar38);
            auVar150 = vpunpckhbw_avx2(auVar92,auVar43);
            auVar92 = *(undefined1 (*) [32])(*pauVar4 + lVar3);
            auVar112 = vpmaddubsw_avx2(auVar96,auVar38);
            auVar96 = vpunpcklbw_avx2(auVar43,auVar92);
            auVar91 = vpmaddubsw_avx2(auVar142,auVar38);
            auVar142 = vpunpckhbw_avx2(auVar43,auVar92);
            auVar40 = vpmaddubsw_avx2(auVar78,auVar51);
            auVar42 = vpmaddubsw_avx2(auVar150,auVar51);
            auVar140 = vpmaddubsw_avx2(auVar96,auVar51);
            auVar39 = vpmaddubsw_avx2(auVar142,auVar51);
            auVar43 = vpaddw_avx2(auVar101,auVar79);
            auVar43 = vpaddw_avx2(auVar43,auVar40);
            auVar101 = vpsraw_avx2(auVar43,6);
            auVar43 = vpaddw_avx2(auVar129,auVar79);
            auVar43 = vpaddw_avx2(auVar43,auVar42);
            auVar43 = vpsraw_avx2(auVar43,6);
            auVar43 = vpackuswb_avx2(auVar101,auVar43);
            *(undefined1 (*) [32])dst = auVar43;
            auVar43 = vpaddw_avx2(auVar112,auVar79);
            auVar43 = vpaddw_avx2(auVar140,auVar43);
            auVar101 = vpsraw_avx2(auVar43,6);
            auVar43 = vpaddw_avx2(auVar91,auVar79);
            auVar43 = vpaddw_avx2(auVar39,auVar43);
            auVar43 = vpsraw_avx2(auVar43,6);
            auVar43 = vpackuswb_avx2(auVar101,auVar43);
            *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar43;
            dst = *(undefined1 (*) [32])dst + dst_stride * 2;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + lVar3 * 2);
            h = h + -2;
          } while (h != 0);
        }
        else {
          pauVar20 = (undefined1 (*) [32])(src + lVar3 * 2);
          uVar24 = 0;
          auVar66._8_2_ = 0x20;
          auVar66._0_8_ = 0x20002000200020;
          auVar66._10_2_ = 0x20;
          auVar66._12_2_ = 0x20;
          auVar66._14_2_ = 0x20;
          auVar66._16_2_ = 0x20;
          auVar66._18_2_ = 0x20;
          auVar66._20_2_ = 0x20;
          auVar66._22_2_ = 0x20;
          auVar66._24_2_ = 0x20;
          auVar66._26_2_ = 0x20;
          auVar66._28_2_ = 0x20;
          auVar66._30_2_ = 0x20;
          do {
            pauVar9 = (undefined1 (*) [32])(dst + uVar24);
            auVar142 = *(undefined1 (*) [32])(*pauVar4 + lVar3 + uVar24);
            auVar92 = *(undefined1 (*) [32])(*pauVar4 + lVar3 * 2 + uVar24);
            auVar78 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar24),auVar142);
            auVar150 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar4 + uVar24),auVar142);
            auVar96 = vpunpcklbw_avx2(auVar142,auVar92);
            auVar142 = vpunpckhbw_avx2(auVar142,auVar92);
            pauVar25 = pauVar20;
            iVar16 = h;
            do {
              auVar43 = *pauVar25;
              auVar101 = vpmaddubsw_avx2(auVar78,auVar38);
              auVar78 = vpunpcklbw_avx2(auVar92,auVar43);
              auVar129 = vpmaddubsw_avx2(auVar150,auVar38);
              auVar150 = vpunpckhbw_avx2(auVar92,auVar43);
              auVar92 = *(undefined1 (*) [32])(*pauVar25 + lVar3);
              auVar112 = vpmaddubsw_avx2(auVar96,auVar38);
              auVar96 = vpunpcklbw_avx2(auVar43,auVar92);
              auVar91 = vpmaddubsw_avx2(auVar142,auVar38);
              auVar142 = vpunpckhbw_avx2(auVar43,auVar92);
              auVar40 = vpmaddubsw_avx2(auVar78,auVar51);
              auVar42 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar140 = vpmaddubsw_avx2(auVar96,auVar51);
              auVar39 = vpmaddubsw_avx2(auVar142,auVar51);
              auVar43 = vpaddw_avx2(auVar101,auVar66);
              auVar43 = vpaddw_avx2(auVar43,auVar40);
              auVar101 = vpsraw_avx2(auVar43,6);
              auVar43 = vpaddw_avx2(auVar129,auVar66);
              auVar43 = vpaddw_avx2(auVar43,auVar42);
              auVar43 = vpsraw_avx2(auVar43,6);
              auVar43 = vpackuswb_avx2(auVar101,auVar43);
              *pauVar9 = auVar43;
              auVar43 = vpaddw_avx2(auVar112,auVar66);
              auVar43 = vpaddw_avx2(auVar140,auVar43);
              auVar101 = vpsraw_avx2(auVar43,6);
              auVar43 = vpaddw_avx2(auVar91,auVar66);
              auVar43 = vpaddw_avx2(auVar39,auVar43);
              auVar43 = vpsraw_avx2(auVar43,6);
              auVar43 = vpackuswb_avx2(auVar101,auVar43);
              *(undefined1 (*) [32])(*pauVar9 + dst_stride) = auVar43;
              pauVar9 = (undefined1 (*) [32])(*pauVar9 + dst_stride * 2);
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar3 * 2);
              iVar16 = iVar16 + -2;
            } while (iVar16 != 0);
            uVar24 = uVar24 + 0x20;
            pauVar20 = pauVar20 + 1;
          } while (uVar24 < (uint)w);
        }
      }
      break;
    case '\x06':
      lVar3 = (long)(src_stride * 2);
      pauVar8 = (undefined1 (*) [16])(src + -lVar3);
      auVar45 = vpsraw_avx(*(undefined1 (*) [16])(piVar2 + uVar24),1);
      if (w < 5) {
        auVar56 = vpshufb_avx(auVar45,_DAT_00567e40);
        auVar75 = vpshufb_avx(auVar45,_DAT_00567e50);
        auVar45 = vpshufb_avx(auVar45,_DAT_00567e60);
        if (w == 2) {
          lVar6 = (long)src_stride;
          uVar12 = (uint)*(short *)(*pauVar8 + lVar6 * 4);
          auVar114 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar8),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar6)));
          auVar131 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar6)),
                                    ZEXT416((uint)(int)*(short *)src));
          auVar114 = vpunpcklbw_avx(auVar114,auVar131);
          auVar131 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar6 * 3)));
          auVar135 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar6 * 3)),
                                    ZEXT416(uVar12));
          auVar131 = vpunpcklbw_avx(auVar131,auVar135);
          auVar105._8_2_ = 0x20;
          auVar105._0_8_ = 0x20002000200020;
          auVar105._10_2_ = 0x20;
          auVar105._12_2_ = 0x20;
          auVar105._14_2_ = 0x20;
          do {
            auVar32 = auVar131;
            auVar131 = vpunpcklwd_avx(ZEXT416(uVar12),
                                      ZEXT416((uint)(int)*(short *)(local_1f0 + lVar6 * 3)));
            uVar12 = (uint)*(short *)(local_1f0 + lVar6 * 4);
            auVar124 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(local_1f0 + lVar6 * 3)),
                                      ZEXT416(uVar12));
            auVar135 = vpmaddubsw_avx(auVar32,auVar75);
            auVar131 = vpunpcklbw_avx(auVar131,auVar124);
            auVar114 = vpmaddubsw_avx(auVar114,auVar56);
            auVar114 = vpaddw_avx(auVar135,auVar114);
            auVar114 = vpaddw_avx(auVar114,auVar105);
            auVar135 = vpmaddubsw_avx(auVar131,auVar45);
            auVar114 = vpaddw_avx(auVar135,auVar114);
            auVar114 = vpsraw_avx(auVar114,6);
            auVar114 = vpackuswb_avx(auVar114,auVar114);
            vpextrw_avx(auVar114,0);
            vpextrw_avx(auVar114,1);
            local_1f0 = local_1f0 + lVar3;
            h = h + -2;
            auVar114 = auVar32;
          } while (h != 0);
        }
        else {
          lVar6 = (long)src_stride;
          uVar12 = *(uint *)(*pauVar8 + lVar6 * 4);
          auVar114 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar8),*(uint *)(*pauVar8 + lVar6),1);
          auVar131 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar6)),*(uint *)src,1);
          auVar135 = vpunpcklbw_avx(auVar114,auVar131);
          auVar114 = vpinsrd_avx(ZEXT416(*(uint *)src),*(uint *)(*pauVar8 + lVar6 * 3),1);
          auVar131 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar6 * 3)),
                                 *(undefined4 *)(*pauVar8 + lVar6 * 4),1);
          auVar114 = vpunpcklbw_avx(auVar114,auVar131);
          auVar69._8_2_ = 0x20;
          auVar69._0_8_ = 0x20002000200020;
          auVar69._10_2_ = 0x20;
          auVar69._12_2_ = 0x20;
          auVar69._14_2_ = 0x20;
          do {
            auVar131 = vpinsrd_avx(ZEXT416(uVar12),*(uint *)(local_1f0 + lVar6 * 3),1);
            auVar124 = vpinsrd_avx(ZEXT416(*(uint *)(local_1f0 + lVar6 * 3)),
                                   *(undefined4 *)(local_1f0 + lVar6 * 4),1);
            auVar135 = vpmaddubsw_avx(auVar135,auVar56);
            auVar32 = vpmaddubsw_avx(auVar114,auVar75);
            auVar124 = vpunpcklbw_avx(auVar131,auVar124);
            uVar12 = *(uint *)(local_1f0 + lVar6 * 4);
            auVar131 = vpaddw_avx(auVar135,auVar32);
            auVar131 = vpaddw_avx(auVar131,auVar69);
            auVar135 = vpmaddubsw_avx(auVar124,auVar45);
            auVar131 = vpaddw_avx(auVar135,auVar131);
            auVar131 = vpsraw_avx(auVar131,6);
            auVar131 = vpackuswb_avx(auVar131,auVar131);
            *(int *)dst = auVar131._0_4_;
            iVar18 = vpextrw_avx(auVar131,3);
            uVar21 = vpextrw_avx(auVar131,2);
            *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
            dst = dst + dst_stride * 2;
            local_1f0 = local_1f0 + lVar3;
            h = h + -2;
            auVar135 = auVar114;
            auVar114 = auVar124;
          } while (h != 0);
        }
      }
      else {
        auVar56 = vpshufb_avx(auVar45,_DAT_00569f60);
        auVar37._0_2_ = auVar56._0_2_;
        auVar37._2_2_ = auVar37._0_2_;
        auVar37._4_2_ = auVar37._0_2_;
        auVar37._6_2_ = auVar37._0_2_;
        auVar37._8_2_ = auVar37._0_2_;
        auVar37._10_2_ = auVar37._0_2_;
        auVar37._12_2_ = auVar37._0_2_;
        auVar37._14_2_ = auVar37._0_2_;
        auVar37._16_2_ = auVar37._0_2_;
        auVar37._18_2_ = auVar37._0_2_;
        auVar37._20_2_ = auVar37._0_2_;
        auVar37._22_2_ = auVar37._0_2_;
        auVar37._24_2_ = auVar37._0_2_;
        auVar37._26_2_ = auVar37._0_2_;
        auVar37._28_2_ = auVar37._0_2_;
        auVar37._30_2_ = auVar37._0_2_;
        auVar56 = vpshufb_avx(auVar45,_DAT_00569f70);
        auVar50._0_2_ = auVar56._0_2_;
        auVar50._2_2_ = auVar50._0_2_;
        auVar50._4_2_ = auVar50._0_2_;
        auVar50._6_2_ = auVar50._0_2_;
        auVar50._8_2_ = auVar50._0_2_;
        auVar50._10_2_ = auVar50._0_2_;
        auVar50._12_2_ = auVar50._0_2_;
        auVar50._14_2_ = auVar50._0_2_;
        auVar50._16_2_ = auVar50._0_2_;
        auVar50._18_2_ = auVar50._0_2_;
        auVar50._20_2_ = auVar50._0_2_;
        auVar50._22_2_ = auVar50._0_2_;
        auVar50._24_2_ = auVar50._0_2_;
        auVar50._26_2_ = auVar50._0_2_;
        auVar50._28_2_ = auVar50._0_2_;
        auVar50._30_2_ = auVar50._0_2_;
        auVar45 = vpshufb_avx(auVar45,_DAT_00569f80);
        auVar64._0_2_ = auVar45._0_2_;
        auVar64._2_2_ = auVar64._0_2_;
        auVar64._4_2_ = auVar64._0_2_;
        auVar64._6_2_ = auVar64._0_2_;
        auVar64._8_2_ = auVar64._0_2_;
        auVar64._10_2_ = auVar64._0_2_;
        auVar64._12_2_ = auVar64._0_2_;
        auVar64._14_2_ = auVar64._0_2_;
        auVar64._16_2_ = auVar64._0_2_;
        auVar64._18_2_ = auVar64._0_2_;
        auVar64._20_2_ = auVar64._0_2_;
        auVar64._22_2_ = auVar64._0_2_;
        auVar64._24_2_ = auVar64._0_2_;
        auVar64._26_2_ = auVar64._0_2_;
        auVar64._28_2_ = auVar64._0_2_;
        auVar64._30_2_ = auVar64._0_2_;
        if (w == 8) {
          lVar6 = (long)src_stride;
          uVar24 = *(ulong *)(*pauVar8 + lVar6 * 4);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(*pauVar8 + lVar6);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)*pauVar8;
          auVar97._0_16_ = ZEXT116(0) * auVar106 + ZEXT116(1) * auVar85;
          auVar97._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar106;
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)src;
          auVar111._0_16_ = ZEXT116(0) * auVar116 + ZEXT116(1) * auVar106;
          auVar111._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar116;
          auVar142 = vpunpcklbw_avx2(auVar97,auVar111);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(*pauVar8 + lVar6 * 3);
          auVar118._0_16_ = ZEXT116(0) * auVar86 + ZEXT116(1) * auVar116;
          auVar118._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar86;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar24;
          auVar98._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar86;
          auVar98._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
          auVar92 = vpunpcklbw_avx2(auVar118,auVar98);
          auVar99._8_2_ = 0x20;
          auVar99._0_8_ = 0x20002000200020;
          auVar99._10_2_ = 0x20;
          auVar99._12_2_ = 0x20;
          auVar99._14_2_ = 0x20;
          auVar99._16_2_ = 0x20;
          auVar99._18_2_ = 0x20;
          auVar99._20_2_ = 0x20;
          auVar99._22_2_ = 0x20;
          auVar99._24_2_ = 0x20;
          auVar99._26_2_ = 0x20;
          auVar99._28_2_ = 0x20;
          auVar99._30_2_ = 0x20;
          do {
            auVar142 = vpmaddubsw_avx2(auVar142,auVar37);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = *(ulong *)(local_1f0 + lVar6 * 3);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar24;
            auVar133._0_16_ = ZEXT116(0) * auVar107 + ZEXT116(1) * auVar72;
            auVar133._16_16_ = ZEXT116(1) * auVar107;
            uVar24 = *(ulong *)(local_1f0 + lVar6 * 4);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar24;
            auVar139._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar107;
            auVar139._16_16_ = ZEXT116(1) * auVar73;
            auVar150 = vpmaddubsw_avx2(auVar92,auVar50);
            auVar96 = vpunpcklbw_avx2(auVar133,auVar139);
            auVar142 = vpaddw_avx2(auVar150,auVar142);
            auVar142 = vpaddw_avx2(auVar142,auVar99);
            auVar150 = vpmaddubsw_avx2(auVar96,auVar64);
            auVar142 = vpaddw_avx2(auVar150,auVar142);
            auVar142 = vpsraw_avx2(auVar142,6);
            auVar142 = vpackuswb_avx2(auVar142,auVar37);
            *(long *)dst = auVar142._0_8_;
            *(long *)(dst + dst_stride) = auVar142._16_8_;
            dst = dst + dst_stride * 2;
            local_1f0 = local_1f0 + lVar3;
            h = h + -2;
            auVar142 = auVar92;
            auVar92 = auVar96;
          } while (h != 0);
        }
        else if (w == 0x10) {
          lVar6 = (long)src_stride;
          auVar45 = *(undefined1 (*) [16])(*pauVar8 + lVar6);
          auVar56 = *(undefined1 (*) [16])src;
          auVar75 = *(undefined1 (*) [16])(*pauVar8 + lVar6 * 3);
          auVar114 = *(undefined1 (*) [16])(*pauVar8 + lVar6 * 4);
          auVar93._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar8;
          auVar93._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar110._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
          auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
          auVar137._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar56;
          auVar137._16_16_ = ZEXT116(1) * auVar75;
          auVar126._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar75;
          auVar126._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar114;
          auVar150 = vpunpcklbw_avx2(auVar93,auVar110);
          auVar96 = vpunpcklbw_avx2(auVar137,auVar126);
          auVar142 = vpunpckhbw_avx2(auVar93,auVar110);
          auVar92 = vpunpckhbw_avx2(auVar137,auVar126);
          auVar94._8_2_ = 0x20;
          auVar94._0_8_ = 0x20002000200020;
          auVar94._10_2_ = 0x20;
          auVar94._12_2_ = 0x20;
          auVar94._14_2_ = 0x20;
          auVar94._16_2_ = 0x20;
          auVar94._18_2_ = 0x20;
          auVar94._20_2_ = 0x20;
          auVar94._22_2_ = 0x20;
          auVar94._24_2_ = 0x20;
          auVar94._26_2_ = 0x20;
          auVar94._28_2_ = 0x20;
          auVar94._30_2_ = 0x20;
          do {
            auVar150 = vpmaddubsw_avx2(auVar150,auVar37);
            auVar78 = vpmaddubsw_avx2(auVar142,auVar37);
            auVar45 = *(undefined1 (*) [16])(local_1f0 + lVar6 * 3);
            auVar145._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar114;
            auVar145._16_16_ = ZEXT116(1) * auVar45;
            auVar114 = *(undefined1 (*) [16])(local_1f0 + lVar6 * 4);
            auVar147._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar45;
            auVar147._16_16_ = ZEXT116(1) * auVar114;
            auVar142 = vpmaddubsw_avx2(auVar96,auVar50);
            auVar112 = vpunpcklbw_avx2(auVar145,auVar147);
            auVar43 = vpmaddubsw_avx2(auVar92,auVar50);
            auVar129 = vpunpckhbw_avx2(auVar145,auVar147);
            auVar142 = vpaddw_avx2(auVar150,auVar142);
            auVar101 = vpmaddubsw_avx2(auVar112,auVar64);
            auVar150 = vpaddw_avx2(auVar78,auVar43);
            auVar78 = vpmaddubsw_avx2(auVar129,auVar64);
            auVar142 = vpaddw_avx2(auVar142,auVar94);
            auVar142 = vpaddw_avx2(auVar142,auVar101);
            auVar43 = vpsraw_avx2(auVar142,6);
            auVar142 = vpaddw_avx2(auVar150,auVar94);
            auVar142 = vpaddw_avx2(auVar142,auVar78);
            auVar142 = vpsraw_avx2(auVar142,6);
            auVar142 = vpackuswb_avx2(auVar43,auVar142);
            *(undefined1 (*) [16])dst = auVar142._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar142._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            local_1f0 = local_1f0 + lVar3;
            h = h + -2;
            auVar142 = auVar92;
            auVar150 = auVar96;
            auVar92 = auVar129;
            auVar96 = auVar112;
          } while (h != 0);
        }
        else {
          lVar6 = (long)src_stride;
          puVar7 = src + lVar6 * 4;
          puVar10 = src + lVar6 * 3;
          uVar24 = 0;
          auVar100._8_2_ = 0x20;
          auVar100._0_8_ = 0x20002000200020;
          auVar100._10_2_ = 0x20;
          auVar100._12_2_ = 0x20;
          auVar100._14_2_ = 0x20;
          auVar100._16_2_ = 0x20;
          auVar100._18_2_ = 0x20;
          auVar100._20_2_ = 0x20;
          auVar100._22_2_ = 0x20;
          auVar100._24_2_ = 0x20;
          auVar100._26_2_ = 0x20;
          auVar100._28_2_ = 0x20;
          auVar100._30_2_ = 0x20;
          do {
            pauVar4 = (undefined1 (*) [32])(dst + uVar24);
            auVar142 = *(undefined1 (*) [32])(*pauVar8 + lVar6 + uVar24);
            auVar92 = *(undefined1 (*) [32])(*pauVar8 + lVar3 + uVar24);
            auVar150 = *(undefined1 (*) [32])(*pauVar8 + lVar6 * 3 + uVar24);
            auVar96 = *(undefined1 (*) [32])(*pauVar8 + lVar6 * 4 + uVar24);
            auVar101 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar8 + uVar24),auVar142);
            auVar91 = vpunpcklbw_avx2(auVar92,auVar150);
            auVar78 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar8 + uVar24),auVar142);
            auVar43 = vpunpckhbw_avx2(auVar92,auVar150);
            auVar129 = vpunpcklbw_avx2(auVar142,auVar92);
            auVar112 = vpunpcklbw_avx2(auVar150,auVar96);
            auVar142 = vpunpckhbw_avx2(auVar142,auVar92);
            auVar92 = vpunpckhbw_avx2(auVar150,auVar96);
            lVar11 = 0;
            iVar16 = h;
            do {
              auVar140 = auVar112;
              auVar40 = auVar92;
              auVar42 = auVar43;
              auVar129 = vpmaddubsw_avx2(auVar129,auVar37);
              auVar112 = vpmaddubsw_avx2(auVar142,auVar37);
              auVar92 = vpmaddubsw_avx2(auVar101,auVar37);
              auVar150 = vpmaddubsw_avx2(auVar78,auVar37);
              auVar142 = *(undefined1 (*) [32])(puVar10 + lVar11);
              auVar78 = vpmaddubsw_avx2(auVar91,auVar50);
              auVar39 = vpunpcklbw_avx2(auVar96,auVar142);
              auVar92 = vpaddw_avx2(auVar92,auVar78);
              auVar78 = vpmaddubsw_avx2(auVar42,auVar50);
              auVar43 = vpunpckhbw_avx2(auVar96,auVar142);
              auVar150 = vpaddw_avx2(auVar150,auVar78);
              auVar96 = vpmaddubsw_avx2(auVar140,auVar50);
              auVar78 = vpaddw_avx2(auVar129,auVar96);
              auVar96 = vpmaddubsw_avx2(auVar40,auVar50);
              auVar101 = vpaddw_avx2(auVar112,auVar96);
              auVar96 = vpmaddubsw_avx2(auVar39,auVar64);
              auVar92 = vpaddw_avx2(auVar92,auVar100);
              auVar92 = vpaddw_avx2(auVar92,auVar96);
              auVar96 = vpmaddubsw_avx2(auVar43,auVar64);
              auVar150 = vpaddw_avx2(auVar150,auVar100);
              auVar150 = vpaddw_avx2(auVar150,auVar96);
              auVar96 = *(undefined1 (*) [32])(puVar7 + lVar11);
              auVar129 = vpsraw_avx2(auVar92,6);
              auVar92 = vpsraw_avx2(auVar150,6);
              auVar150 = vpackuswb_avx2(auVar129,auVar92);
              auVar112 = vpunpcklbw_avx2(auVar142,auVar96);
              auVar92 = vpunpckhbw_avx2(auVar142,auVar96);
              *pauVar4 = auVar150;
              auVar150 = vpmaddubsw_avx2(auVar112,auVar64);
              auVar142 = vpaddw_avx2(auVar78,auVar100);
              auVar142 = vpaddw_avx2(auVar142,auVar150);
              auVar78 = vpmaddubsw_avx2(auVar92,auVar64);
              auVar150 = vpaddw_avx2(auVar101,auVar100);
              auVar150 = vpaddw_avx2(auVar150,auVar78);
              auVar142 = vpsraw_avx2(auVar142,6);
              auVar150 = vpsraw_avx2(auVar150,6);
              auVar142 = vpackuswb_avx2(auVar142,auVar150);
              *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar142;
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
              lVar11 = lVar11 + lVar3;
              iVar16 = iVar16 + -2;
              auVar101 = auVar91;
              auVar91 = auVar39;
              auVar78 = auVar42;
              auVar129 = auVar140;
              auVar142 = auVar40;
            } while (iVar16 != 0);
            uVar24 = uVar24 + 0x20;
            puVar7 = puVar7 + 0x20;
            puVar10 = puVar10 + 0x20;
          } while (uVar24 < (uint)w);
        }
      }
      break;
    case '\b':
      lVar3 = (long)(src_stride * 3);
      pauVar8 = (undefined1 (*) [16])(src + -lVar3);
      auVar45 = vpsraw_avx(*(undefined1 (*) [16])(piVar2 + uVar24),1);
      if (w < 5) {
        auVar56 = vpshufb_avx(auVar45,_DAT_005156d0);
        auVar75 = vpshufb_avx(auVar45,_DAT_00515720);
        auVar114 = vpshufb_avx(auVar45,_DAT_005156f0);
        auVar45 = vpshufb_avx(auVar45,_DAT_00515730);
        if (w == 2) {
          lVar3 = (long)src_stride;
          uVar12 = (uint)*(short *)(*pauVar8 + lVar3 * 6);
          auVar131 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar8),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3)));
          auVar135 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3)),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 2)));
          auVar131 = vpunpcklbw_avx(auVar131,auVar135);
          auVar135 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 2)),
                                    ZEXT416((uint)(int)*(short *)src));
          auVar124 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 4)));
          auVar135 = vpunpcklbw_avx(auVar135,auVar124);
          auVar124 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 4)),
                                    ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 5)));
          auVar32 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 5)),
                                   ZEXT416(uVar12));
          auVar124 = vpunpcklbw_avx(auVar124,auVar32);
          auVar123._8_2_ = 0x20;
          auVar123._0_8_ = 0x20002000200020;
          auVar123._10_2_ = 0x20;
          auVar123._12_2_ = 0x20;
          auVar123._14_2_ = 0x20;
          do {
            auVar131 = vpmaddubsw_avx(auVar131,auVar56);
            auVar32 = vpmaddubsw_avx(auVar135,auVar75);
            auVar87 = vpunpcklwd_avx(ZEXT416(uVar12),
                                     ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 7)));
            uVar12 = (uint)*(short *)(*pauVar8 + lVar3 * 8);
            auVar88 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar8 + lVar3 * 7)),
                                     ZEXT416(uVar12));
            auVar87 = vpunpcklbw_avx(auVar87,auVar88);
            auVar131 = vpaddw_avx(auVar131,auVar32);
            auVar32 = vpmaddubsw_avx(auVar124,auVar114);
            auVar131 = vpaddw_avx(auVar131,auVar32);
            auVar131 = vpaddw_avx(auVar131,auVar123);
            auVar32 = vpmaddubsw_avx(auVar87,auVar45);
            auVar131 = vpaddw_avx(auVar131,auVar32);
            auVar131 = vpsraw_avx(auVar131,6);
            auVar131 = vpackuswb_avx(auVar131,auVar131);
            vpextrw_avx(auVar131,0);
            vpextrw_avx(auVar131,1);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
            h = h + -2;
            auVar131 = auVar135;
            auVar135 = auVar124;
            auVar124 = auVar87;
          } while (h != 0);
        }
        else {
          lVar3 = (long)src_stride;
          auVar131 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar8),*(uint *)(*pauVar8 + lVar3),1);
          auVar135 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar3)),
                                 *(uint *)(*pauVar8 + lVar3 * 2),1);
          auVar124 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar3 * 2)),*(uint *)src,1);
          uVar12 = *(uint *)(*pauVar8 + lVar3 * 6);
          auVar32 = vpinsrd_avx(ZEXT416(*(uint *)src),*(uint *)(*pauVar8 + lVar3 * 4),1);
          auVar87 = vpunpcklbw_avx(auVar131,auVar135);
          auVar131 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar3 * 4)),
                                 *(uint *)(*pauVar8 + lVar3 * 5),1);
          auVar124 = vpunpcklbw_avx(auVar124,auVar32);
          auVar135 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar3 * 5)),
                                 *(undefined4 *)(*pauVar8 + lVar3 * 6),1);
          auVar131 = vpunpcklbw_avx(auVar131,auVar135);
          auVar115._8_2_ = 0x20;
          auVar115._0_8_ = 0x20002000200020;
          auVar115._10_2_ = 0x20;
          auVar115._12_2_ = 0x20;
          auVar115._14_2_ = 0x20;
          do {
            auVar88 = auVar131;
            auVar32 = vpmaddubsw_avx(auVar87,auVar56);
            auVar87 = vpmaddubsw_avx(auVar124,auVar75);
            auVar131 = vpinsrd_avx(ZEXT416(uVar12),*(uint *)(*pauVar8 + lVar3 * 7),1);
            auVar135 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar8 + lVar3 * 7)),
                                   *(undefined4 *)(*pauVar8 + lVar3 * 8),1);
            auVar131 = vpunpcklbw_avx(auVar131,auVar135);
            uVar12 = *(uint *)(*pauVar8 + lVar3 * 8);
            auVar135 = vpaddw_avx(auVar32,auVar87);
            auVar32 = vpmaddubsw_avx(auVar88,auVar114);
            auVar135 = vpaddw_avx(auVar135,auVar32);
            auVar135 = vpaddw_avx(auVar135,auVar115);
            auVar32 = vpmaddubsw_avx(auVar131,auVar45);
            auVar135 = vpaddw_avx(auVar135,auVar32);
            auVar135 = vpsraw_avx(auVar135,6);
            auVar135 = vpackuswb_avx(auVar135,auVar135);
            *(int *)dst = auVar135._0_4_;
            iVar18 = vpextrw_avx(auVar135,3);
            uVar21 = vpextrw_avx(auVar135,2);
            *(uint *)(dst + dst_stride) = uVar21 | iVar18 << 0x10;
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
            dst = dst + dst_stride * 2;
            h = h + -2;
            auVar87 = auVar124;
            auVar124 = auVar88;
          } while (h != 0);
        }
      }
      else {
        auVar56 = vpshufb_avx(auVar45,_DAT_00569fa0);
        uVar26 = auVar56._0_2_;
        auVar142._2_2_ = uVar26;
        auVar142._0_2_ = uVar26;
        auVar142._4_2_ = uVar26;
        auVar142._6_2_ = uVar26;
        auVar142._8_2_ = uVar26;
        auVar142._10_2_ = uVar26;
        auVar142._12_2_ = uVar26;
        auVar142._14_2_ = uVar26;
        auVar142._16_2_ = uVar26;
        auVar142._18_2_ = uVar26;
        auVar142._20_2_ = uVar26;
        auVar142._22_2_ = uVar26;
        auVar142._24_2_ = uVar26;
        auVar142._26_2_ = uVar26;
        auVar142._28_2_ = uVar26;
        auVar142._30_2_ = uVar26;
        auVar56 = vpshufb_avx(auVar45,_DAT_00569f00);
        uVar26 = auVar56._0_2_;
        auVar96._2_2_ = uVar26;
        auVar96._0_2_ = uVar26;
        auVar96._4_2_ = uVar26;
        auVar96._6_2_ = uVar26;
        auVar96._8_2_ = uVar26;
        auVar96._10_2_ = uVar26;
        auVar96._12_2_ = uVar26;
        auVar96._14_2_ = uVar26;
        auVar96._16_2_ = uVar26;
        auVar96._18_2_ = uVar26;
        auVar96._20_2_ = uVar26;
        auVar96._22_2_ = uVar26;
        auVar96._24_2_ = uVar26;
        auVar96._26_2_ = uVar26;
        auVar96._28_2_ = uVar26;
        auVar96._30_2_ = uVar26;
        auVar56 = vpshufb_avx(auVar45,_DAT_00569f10);
        uVar26 = auVar56._0_2_;
        auVar92._2_2_ = uVar26;
        auVar92._0_2_ = uVar26;
        auVar92._4_2_ = uVar26;
        auVar92._6_2_ = uVar26;
        auVar92._8_2_ = uVar26;
        auVar92._10_2_ = uVar26;
        auVar92._12_2_ = uVar26;
        auVar92._14_2_ = uVar26;
        auVar92._16_2_ = uVar26;
        auVar92._18_2_ = uVar26;
        auVar92._20_2_ = uVar26;
        auVar92._22_2_ = uVar26;
        auVar92._24_2_ = uVar26;
        auVar92._26_2_ = uVar26;
        auVar92._28_2_ = uVar26;
        auVar92._30_2_ = uVar26;
        auVar45 = vpshufb_avx(auVar45,_DAT_00569fb0);
        uVar26 = auVar45._0_2_;
        auVar150._2_2_ = uVar26;
        auVar150._0_2_ = uVar26;
        auVar150._4_2_ = uVar26;
        auVar150._6_2_ = uVar26;
        auVar150._8_2_ = uVar26;
        auVar150._10_2_ = uVar26;
        auVar150._12_2_ = uVar26;
        auVar150._14_2_ = uVar26;
        auVar150._16_2_ = uVar26;
        auVar150._18_2_ = uVar26;
        auVar150._20_2_ = uVar26;
        auVar150._22_2_ = uVar26;
        auVar150._24_2_ = uVar26;
        auVar150._26_2_ = uVar26;
        auVar150._28_2_ = uVar26;
        auVar150._30_2_ = uVar26;
        if (w == 8) {
          lVar3 = (long)src_stride;
          uVar24 = *(ulong *)(*pauVar8 + lVar3 * 6);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)(*pauVar8 + lVar3);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)*pauVar8;
          auVar78._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar45;
          auVar78._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar114;
          auVar135._8_8_ = 0;
          auVar135._0_8_ = *(ulong *)(*pauVar8 + lVar3 * 2);
          auVar129._0_16_ = ZEXT116(0) * auVar135 + ZEXT116(1) * auVar114;
          auVar129._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar135;
          auVar78 = vpunpcklbw_avx2(auVar78,auVar129);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)src;
          auVar112._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar135;
          auVar112._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
          auVar124._8_8_ = 0;
          auVar124._0_8_ = *(ulong *)(*pauVar8 + lVar3 * 4);
          auVar43._0_16_ = ZEXT116(0) * auVar124 + ZEXT116(1) * auVar56;
          auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar124;
          auVar43 = vpunpcklbw_avx2(auVar112,auVar43);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *(ulong *)(*pauVar8 + lVar3 * 5);
          auVar91._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar124;
          auVar91._16_16_ = ZEXT116(1) * auVar75;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = uVar24;
          auVar101._0_16_ = ZEXT116(0) * auVar131 + ZEXT116(1) * auVar75;
          auVar101._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar131;
          auVar101 = vpunpcklbw_avx2(auVar91,auVar101);
          auVar40._8_2_ = 0x20;
          auVar40._0_8_ = 0x20002000200020;
          auVar40._10_2_ = 0x20;
          auVar40._12_2_ = 0x20;
          auVar40._14_2_ = 0x20;
          auVar40._16_2_ = 0x20;
          auVar40._18_2_ = 0x20;
          auVar40._20_2_ = 0x20;
          auVar40._22_2_ = 0x20;
          auVar40._24_2_ = 0x20;
          auVar40._26_2_ = 0x20;
          auVar40._28_2_ = 0x20;
          auVar40._30_2_ = 0x20;
          do {
            auVar112 = auVar101;
            auVar78 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar129 = vpmaddubsw_avx2(auVar43,auVar96);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)(*pauVar8 + lVar3 * 7);
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uVar24;
            auVar140._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar87;
            auVar140._16_16_ = ZEXT116(1) * auVar32;
            uVar24 = *(ulong *)(*pauVar8 + lVar3 * 8);
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar24;
            auVar42._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar32;
            auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
            auVar101 = vpunpcklbw_avx2(auVar140,auVar42);
            auVar78 = vpaddw_avx2(auVar129,auVar78);
            auVar129 = vpmaddubsw_avx2(auVar112,auVar92);
            auVar78 = vpaddw_avx2(auVar129,auVar78);
            auVar78 = vpaddw_avx2(auVar78,auVar40);
            auVar129 = vpmaddubsw_avx2(auVar101,auVar150);
            auVar78 = vpaddw_avx2(auVar129,auVar78);
            auVar78 = vpsraw_avx2(auVar78,6);
            auVar78 = vpackuswb_avx2(auVar78,auVar101);
            *(long *)dst = auVar78._0_8_;
            *(long *)(dst + dst_stride) = auVar78._16_8_;
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
            dst = dst + dst_stride * 2;
            h = h + -2;
            auVar78 = auVar43;
            auVar43 = auVar112;
          } while (h != 0);
        }
        else if (w == 0x10) {
          lVar3 = (long)src_stride;
          auVar45 = *(undefined1 (*) [16])(*pauVar8 + lVar3);
          auVar56 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
          auVar75 = *(undefined1 (*) [16])src;
          auVar114 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 4);
          auVar131 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 5);
          auVar135 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 6);
          auVar39._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar8;
          auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar52._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar45;
          auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
          auVar138._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar56;
          auVar138._16_16_ = ZEXT116(1) * auVar75;
          auVar117._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar75;
          auVar117._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar114;
          auVar127._0_16_ = ZEXT116(0) * auVar131 + ZEXT116(1) * auVar114;
          auVar127._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar131;
          auVar148._0_16_ = ZEXT116(0) * auVar135 + ZEXT116(1) * auVar131;
          auVar148._16_16_ = ZEXT116(1) * auVar135;
          auVar129 = vpunpcklbw_avx2(auVar39,auVar52);
          auVar112 = vpunpcklbw_avx2(auVar138,auVar117);
          auVar91 = vpunpcklbw_avx2(auVar127,auVar148);
          auVar78 = vpunpckhbw_avx2(auVar39,auVar52);
          auVar43 = vpunpckhbw_avx2(auVar138,auVar117);
          auVar101 = vpunpckhbw_avx2(auVar127,auVar148);
          local_1d8._8_2_ = 0x20;
          local_1d8._0_8_ = 0x20002000200020;
          local_1d8._10_2_ = 0x20;
          local_1d8._12_2_ = 0x20;
          local_1d8._14_2_ = 0x20;
          local_1d8._16_2_ = 0x20;
          local_1d8._18_2_ = 0x20;
          local_1d8._20_2_ = 0x20;
          local_1d8._22_2_ = 0x20;
          local_1d8._24_2_ = 0x20;
          local_1d8._26_2_ = 0x20;
          local_1d8._28_2_ = 0x20;
          local_1d8._30_2_ = 0x20;
          do {
            auVar52 = auVar91;
            auVar129 = vpmaddubsw_avx2(auVar129,auVar142);
            auVar40 = vpmaddubsw_avx2(auVar112,auVar96);
            auVar42 = vpmaddubsw_avx2(auVar78,auVar142);
            auVar140 = vpmaddubsw_avx2(auVar43,auVar96);
            auVar45 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 7);
            auVar152._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar135;
            auVar152._16_16_ = ZEXT116(1) * auVar45;
            auVar135 = *(undefined1 (*) [16])(*pauVar8 + lVar3 * 8);
            auVar128._0_16_ = ZEXT116(0) * auVar135 + ZEXT116(1) * auVar45;
            auVar128._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar135
            ;
            auVar91 = vpunpcklbw_avx2(auVar152,auVar128);
            auVar39 = vpunpckhbw_avx2(auVar152,auVar128);
            auVar78 = vpaddw_avx2(auVar129,auVar40);
            auVar129 = vpmaddubsw_avx2(auVar52,auVar92);
            auVar78 = vpaddw_avx2(auVar78,auVar129);
            auVar40 = vpmaddubsw_avx2(auVar91,auVar150);
            auVar129 = vpaddw_avx2(auVar42,auVar140);
            auVar42 = vpmaddubsw_avx2(auVar101,auVar92);
            auVar129 = vpaddw_avx2(auVar129,auVar42);
            auVar42 = vpmaddubsw_avx2(auVar39,auVar150);
            auVar78 = vpaddw_avx2(local_1d8,auVar78);
            auVar78 = vpaddw_avx2(auVar78,auVar40);
            auVar40 = vpsraw_avx2(auVar78,6);
            auVar78 = vpaddw_avx2(auVar129,local_1d8);
            auVar78 = vpaddw_avx2(auVar42,auVar78);
            auVar78 = vpsraw_avx2(auVar78,6);
            auVar78 = vpackuswb_avx2(auVar40,auVar78);
            *(undefined1 (*) [16])dst = auVar78._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar78._16_16_;
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar3 * 2);
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            h = h + -2;
            auVar78 = auVar43;
            auVar129 = auVar112;
            auVar43 = auVar101;
            auVar101 = auVar39;
            auVar112 = auVar52;
          } while (h != 0);
        }
        else {
          lVar11 = (long)src_stride;
          lVar6 = lVar11 * 8 - lVar3;
          lVar19 = lVar11 * 7 - lVar3;
          uVar24 = 0;
          auVar104 = ZEXT3264(CONCAT230(0x20,CONCAT228(0x20,CONCAT226(0x20,CONCAT224(0x20,CONCAT222(
                                                  0x20,CONCAT220(0x20,CONCAT218(0x20,CONCAT216(0x20,
                                                  CONCAT214(0x20,CONCAT212(0x20,CONCAT210(0x20,
                                                  CONCAT28(0x20,0x20002000200020)))))))))))));
          do {
            pauVar4 = (undefined1 (*) [32])(dst + uVar24);
            auVar78 = *(undefined1 (*) [32])(*pauVar8 + lVar11 + uVar24);
            auVar43 = *(undefined1 (*) [32])(*pauVar8 + lVar11 * 2 + uVar24);
            auVar101 = *(undefined1 (*) [32])(*pauVar8 + lVar3 + uVar24);
            auVar129 = *(undefined1 (*) [32])(*pauVar8 + lVar11 * 4 + uVar24);
            auVar112 = *(undefined1 (*) [32])(*pauVar8 + lVar11 * 5 + uVar24);
            auVar91 = *(undefined1 (*) [32])(*pauVar8 + lVar11 * 6 + uVar24);
            auVar140 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar8 + uVar24),auVar78);
            local_1d8 = vpunpcklbw_avx2(auVar43,auVar101);
            auVar39 = vpunpcklbw_avx2(auVar129,auVar112);
            auVar40 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar8 + uVar24),auVar78);
            local_198 = vpunpckhbw_avx2(auVar43,auVar101);
            auVar42 = vpunpckhbw_avx2(auVar129,auVar112);
            auVar52 = vpunpcklbw_avx2(auVar78,auVar43);
            auVar117 = vpunpcklbw_avx2(auVar101,auVar129);
            auVar127 = vpunpcklbw_avx2(auVar112,auVar91);
            auVar78 = vpunpckhbw_avx2(auVar78,auVar43);
            local_178 = vpunpckhbw_avx2(auVar101,auVar129);
            auVar43 = vpunpckhbw_avx2(auVar112,auVar91);
            puVar7 = src;
            iVar16 = h;
            do {
              auVar128 = auVar42;
              auVar148 = auVar43;
              auVar152 = auVar39;
              auVar129 = vpmaddubsw_avx2(auVar52,auVar142);
              auVar112 = vpmaddubsw_avx2(auVar117,auVar96);
              auVar52 = vpmaddubsw_avx2(auVar78,auVar142);
              auVar37 = auVar104._0_32_;
              auVar138 = vpmaddubsw_avx2(local_178,auVar96);
              auVar78 = vpmaddubsw_avx2(auVar140,auVar142);
              auVar43 = vpmaddubsw_avx2(local_1d8,auVar96);
              auVar101 = vpmaddubsw_avx2(auVar40,auVar142);
              auVar78 = vpaddw_avx2(auVar78,auVar43);
              auVar43 = vpmaddubsw_avx2(auVar152,auVar92);
              auVar43 = vpaddw_avx2(auVar78,auVar43);
              auVar78 = vpmaddubsw_avx2(local_198,auVar96);
              auVar78 = vpaddw_avx2(auVar78,auVar101);
              auVar101 = vpmaddubsw_avx2(auVar128,auVar92);
              auVar101 = vpaddw_avx2(auVar78,auVar101);
              auVar78 = *(undefined1 (*) [32])(puVar7 + lVar19);
              auVar129 = vpaddw_avx2(auVar129,auVar112);
              auVar112 = vpmaddubsw_avx2(auVar127,auVar92);
              auVar129 = vpaddw_avx2(auVar129,auVar112);
              auVar39 = vpunpcklbw_avx2(auVar91,auVar78);
              auVar42 = vpunpckhbw_avx2(auVar91,auVar78);
              auVar112 = vpaddw_avx2(auVar138,auVar52);
              auVar91 = vpmaddubsw_avx2(auVar148,auVar92);
              auVar112 = vpaddw_avx2(auVar112,auVar91);
              auVar91 = vpmaddubsw_avx2(auVar39,auVar150);
              auVar43 = vpaddw_avx2(auVar43,auVar37);
              auVar43 = vpaddw_avx2(auVar43,auVar91);
              auVar91 = vpmaddubsw_avx2(auVar42,auVar150);
              auVar101 = vpaddw_avx2(auVar101,auVar37);
              auVar101 = vpaddw_avx2(auVar101,auVar91);
              auVar91 = *(undefined1 (*) [32])(puVar7 + lVar6);
              auVar43 = vpsraw_avx2(auVar43,6);
              auVar101 = vpsraw_avx2(auVar101,6);
              auVar101 = vpackuswb_avx2(auVar43,auVar101);
              auVar104 = ZEXT3264(auVar37);
              auVar138 = vpunpcklbw_avx2(auVar78,auVar91);
              auVar43 = vpunpckhbw_avx2(auVar78,auVar91);
              *pauVar4 = auVar101;
              auVar101 = vpmaddubsw_avx2(auVar138,auVar150);
              auVar78 = vpaddw_avx2(auVar129,auVar37);
              auVar78 = vpaddw_avx2(auVar78,auVar101);
              auVar129 = vpmaddubsw_avx2(auVar43,auVar150);
              auVar101 = vpaddw_avx2(auVar112,auVar37);
              auVar101 = vpaddw_avx2(auVar101,auVar129);
              auVar78 = vpsraw_avx2(auVar78,6);
              auVar101 = vpsraw_avx2(auVar101,6);
              auVar78 = vpackuswb_avx2(auVar78,auVar101);
              *(undefined1 (*) [32])(*pauVar4 + dst_stride) = auVar78;
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride * 2);
              puVar7 = puVar7 + lVar11 * 2;
              iVar16 = iVar16 + -2;
              auVar52 = auVar117;
              auVar78 = local_178;
              auVar40 = local_198;
              auVar117 = auVar127;
              auVar140 = local_1d8;
              auVar127 = auVar138;
              local_1d8 = auVar152;
              local_198 = auVar128;
              local_178 = auVar148;
            } while (iVar16 != 0);
            uVar24 = uVar24 + 0x20;
            lVar6 = lVar6 + 0x20;
            lVar19 = lVar19 + 0x20;
          } while (uVar24 < (uint)w);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_y_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_y,
                            const int32_t subpel_y_qn) {
#if CONFIG_SVT_AV1
  const int vert_tap = get_filter_tap(filter_params_y, subpel_y_qn);

  if (vert_tap == 12) {
    av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn);
  } else {
    av1_convolve_y_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_y, subpel_y_qn);
  }
#else
  av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_y, subpel_y_qn);
#endif
}